

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterWriteVFormatCDATA(xmlTextWriterPtr writer,char *format,__va_list_tag *argptr)

{
  int iVar1;
  xmlChar *content;
  
  if ((writer != (xmlTextWriterPtr)0x0) &&
     (content = xmlTextWriterVSprintf(format,argptr), content != (xmlChar *)0x0)) {
    iVar1 = xmlTextWriterWriteCDATA(writer,content);
    (*xmlFree)(content);
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlTextWriterWriteVFormatCDATA(xmlTextWriterPtr writer, const char *format,
                               va_list argptr)
{
    int rc;
    xmlChar *buf;

    if (writer == NULL)
        return -1;

    buf = xmlTextWriterVSprintf(format, argptr);
    if (buf == NULL)
        return -1;

    rc = xmlTextWriterWriteCDATA(writer, buf);

    xmlFree(buf);
    return rc;
}